

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O2

void __thiscall kj::UnixEventPort::gotSignal(UnixEventPort *this,siginfo_t *siginfo)

{
  ChildSet *this_00;
  PromiseFulfiller<siginfo_t> *pPVar1;
  SignalPromiseAdapter *this_01;
  long lVar2;
  siginfo_t *psVar3;
  undefined8 *puVar4;
  byte bVar5;
  undefined8 local_a0 [16];
  
  bVar5 = 0;
  this_00 = (this->childSet).ptr.ptr;
  if ((this_00 != (ChildSet *)0x0) && (siginfo->si_signo == 0x11)) {
    ChildSet::checkExits(this_00);
    return;
  }
  this_01 = this->signalHead;
  while (this_01 != (SignalPromiseAdapter *)0x0) {
    if (this_01->signum == siginfo->si_signo) {
      pPVar1 = this_01->fulfiller;
      psVar3 = siginfo;
      puVar4 = local_a0;
      for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar4 = *(undefined8 *)psVar3;
        psVar3 = (siginfo_t *)((long)psVar3 + (ulong)bVar5 * -0x10 + 8);
        puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
      }
      (**pPVar1->_vptr_PromiseFulfiller)(pPVar1,local_a0);
      this_01 = SignalPromiseAdapter::removeFromList(this_01);
    }
    else {
      this_01 = this_01->next;
    }
  }
  return;
}

Assistant:

void UnixEventPort::gotSignal(const siginfo_t& siginfo) {
  // If onChildExit() has been called and this is SIGCHLD, check for child exits.
  KJ_IF_MAYBE(cs, childSet) {
    if (siginfo.si_signo == SIGCHLD) {
      cs->get()->checkExits();
      return;
    }
  }

  // Fire any events waiting on this signal.
  auto ptr = signalHead;
  while (ptr != nullptr) {
    if (ptr->signum == siginfo.si_signo) {
      ptr->fulfiller.fulfill(kj::cp(siginfo));
      ptr = ptr->removeFromList();
    } else {
      ptr = ptr->next;
    }
  }
}